

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * google::protobuf::compiler::js::anon_unknown_0::ModuleAlias
                   (string *__return_storage_ptr__,string *filename)

{
  string *extraout_RAX;
  string *psVar1;
  string basename;
  string local_38;
  
  StripProto(&local_38,filename);
  StripString(&local_38,"-",'$');
  StripString(&local_38,"/",'_');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_38._M_dataplus._M_p,
             local_38._M_dataplus._M_p + local_38._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  psVar1 = (string *)&local_38.field_2;
  if ((string *)local_38._M_dataplus._M_p != psVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    psVar1 = extraout_RAX;
  }
  return psVar1;
}

Assistant:

string ModuleAlias(const string& filename) {
  // This scheme could technically cause problems if a file includes any 2 of:
  //   foo/bar_baz.proto
  //   foo_bar_baz.proto
  //   foo_bar/baz.proto
  //
  // We'll worry about this problem if/when we actually see it.  This name isn't
  // exposed to users so we can change it later if we need to.
  string basename = StripProto(filename);
  StripString(&basename, "-", '$');
  StripString(&basename, "/", '_');
  return basename + "_pb";
}